

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set_Record_R_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Set_Record_R_PDU::SetRecordSets
          (Set_Record_R_PDU *this,
          vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_> *RS)

{
  KUINT16 *pKVar1;
  pointer pRVar2;
  KUINT16 KVar3;
  pointer pRVar4;
  pointer pRVar5;
  
  pRVar4 = (this->m_vRecs).
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (this->m_vRecs).
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar4 != pRVar2) {
    do {
      KVar3 = DATA_TYPE::RecordSet::GetRecordLength(pRVar4);
      pKVar1 = &(this->super_Simulation_Management_Header).super_Header.super_Header6.
                m_ui16PDULength;
      *pKVar1 = *pKVar1 - KVar3;
      pRVar4 = pRVar4 + 1;
    } while (pRVar4 != pRVar2);
    pRVar4 = (this->m_vRecs).
             super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar2 = (this->m_vRecs).
             super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pRVar5 = pRVar4;
    if (pRVar2 != pRVar4) {
      do {
        (**(pRVar5->super_DataTypeBase)._vptr_DataTypeBase)(pRVar5);
        pRVar5 = pRVar5 + 1;
      } while (pRVar5 != pRVar2);
      (this->m_vRecs).
      super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>.
      _M_impl.super__Vector_impl_data._M_finish = pRVar4;
    }
  }
  std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::operator=
            (&this->m_vRecs,RS);
  pRVar4 = (this->m_vRecs).
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (this->m_vRecs).
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->m_ui32NumRecSets = (int)((ulong)((long)pRVar2 - (long)pRVar4) >> 4) * -0x55555555;
  if (pRVar2 != pRVar4) {
    do {
      KVar3 = DATA_TYPE::RecordSet::GetRecordLength(pRVar4);
      pKVar1 = &(this->super_Simulation_Management_Header).super_Header.super_Header6.
                m_ui16PDULength;
      *pKVar1 = *pKVar1 + KVar3;
      pRVar4 = pRVar4 + 1;
    } while (pRVar4 != (this->m_vRecs).
                       super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void Set_Record_R_PDU::SetRecordSets( const vector<RecordSet> & RS )
{
    // Reset the PDU size.
    vector<RecordSet>::const_iterator citr = m_vRecs.begin();
    vector<RecordSet>::const_iterator citrEnd = m_vRecs.end();

    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength -= citr->GetRecordLength();
    }

    m_vRecs.clear();
    m_vRecs = RS;
    m_ui32NumRecSets = m_vRecs.size();

    // Calculate the new PDU size
    for( citr = m_vRecs.begin(); citr != m_vRecs.end(); ++citr )
    {
        m_ui16PDULength += citr->GetRecordLength();
    }
}